

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

cmPropertyDefinition * __thiscall
cmState::GetPropertyDefinition(cmState *this,string *name,ScopeType scope)

{
  bool bVar1;
  _Base_ptr p_Var2;
  const_iterator cVar3;
  cmPropertyDefinition *pcVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  
  bVar1 = IsPropertyDefined(this,name,scope);
  if (bVar1) {
    p_Var2 = (this->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var6 = &(this->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var5 = p_Var6;
    if (p_Var2 != (_Base_ptr)0x0) {
      do {
        if ((int)scope <= (int)p_Var2[1]._M_color) {
          p_Var5 = p_Var2;
        }
        p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < (int)scope];
      } while (p_Var2 != (_Base_ptr)0x0);
      if ((p_Var5 != p_Var6) && ((int)p_Var5[1]._M_color <= (int)scope)) {
        p_Var6 = p_Var5;
      }
    }
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPropertyDefinition>_>_>
                    *)&p_Var6[1]._M_parent,name);
    pcVar4 = (cmPropertyDefinition *)(cVar3._M_node + 2);
  }
  else {
    pcVar4 = (cmPropertyDefinition *)0x0;
  }
  return pcVar4;
}

Assistant:

cmPropertyDefinition const* cmState::GetPropertyDefinition(
  const std::string& name, cmProperty::ScopeType scope) const
{
  if (this->IsPropertyDefined(name, scope)) {
    cmPropertyDefinitionMap const& defs =
      this->PropertyDefinitions.find(scope)->second;
    return &defs.find(name)->second;
  }
  return nullptr;
}